

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPTCPTransmitter::AddDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  SocketType s;
  int local_2c;
  SocketData local_28;
  
  iVar1 = -0xb5;
  if (((this->m_init == true) && (iVar1 = -0xbb, this->m_created == true)) &&
     (iVar1 = -0xbc, addr->addresstype == TCPAddress)) {
    local_2c = *(int *)&addr->field_0xc;
    if (local_2c == 0) {
      iVar1 = -0xbd;
    }
    else {
      iVar2 = std::
              _Rb_tree<int,_std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>,_std::_Select1st<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
              ::find(&(this->m_destSockets)._M_t,&local_2c);
      iVar1 = -0xc2;
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header) {
        SocketData::SocketData(&local_28);
        pmVar3 = std::
                 map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                 ::operator[](&this->m_destSockets,&local_2c);
        pmVar3->m_pDataBuffer = local_28.m_pDataBuffer;
        pmVar3->m_lengthBuffer[0] = local_28.m_lengthBuffer[0];
        pmVar3->m_lengthBuffer[1] = local_28.m_lengthBuffer[1];
        *(undefined2 *)&pmVar3->field_0x2 = local_28._2_2_;
        pmVar3->m_lengthBufferOffset = local_28.m_lengthBufferOffset;
        pmVar3->m_dataLength = local_28.m_dataLength;
        pmVar3->m_dataBufferOffset = local_28.m_dataBufferOffset;
        SocketData::~SocketData(&local_28);
        RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::AddDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	int status = ValidateSocket(s);
	if (status != 0)
	{
		MAINMUTEX_UNLOCK
		return status;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it != m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETALREADYINDESTINATIONS;
	}
	m_destSockets[s] = SocketData();

	// Because the sockets are also used for incoming data, we'll abort a wait
	// that may be in progress, otherwise it could take a few seconds until the
	// new socket is monitored for incoming data
	m_pAbortDesc->SendAbortSignal();

	MAINMUTEX_UNLOCK
	return 0;
}